

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O2

void de::anon_unknown_0::multiThreadTest(int numThreads)

{
  deUint32 dVar1;
  pointer ppTVar2;
  TestThread *this;
  long lVar3;
  ulong uVar4;
  int ndx;
  ulong uVar5;
  deInt32 sharedVar;
  vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  local_60;
  SpinBarrier barrier;
  
  SpinBarrier::SpinBarrier(&barrier,numThreads);
  sharedVar = 0;
  uVar4 = (ulong)(uint)numThreads * 8;
  ppTVar2 = (pointer)operator_new(uVar4);
  local_60.
  super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppTVar2 + (uint)numThreads;
  local_60.
  super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppTVar2;
  if (numThreads != 0) {
    for (lVar3 = 0;
        local_60.
        super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_60.
             super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage, uVar4 - lVar3 != 0;
        lVar3 = lVar3 + 8) {
      *(undefined8 *)((long)ppTVar2 + lVar3) = 0;
    }
  }
  uVar5 = 0;
  uVar4 = 0;
  if (0 < numThreads) {
    uVar4 = (ulong)(uint)numThreads;
  }
  local_60.
  super__Vector_base<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ._M_impl.super__Vector_impl_data._M_start = ppTVar2;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    this = (TestThread *)operator_new(0x38);
    Thread::Thread((Thread *)this);
    (this->super_Thread)._vptr_Thread = (_func_int **)&PTR__Thread_00c250c8;
    this->m_barrier = &barrier;
    this->m_sharedVar = &sharedVar;
    this->m_numThreads = numThreads;
    this->m_threadNdx = (int)uVar5;
    dVar1 = deGetNumAvailableLogicalCores();
    this->m_busyOk = (uint)numThreads <= dVar1;
    ppTVar2[uVar5] = this;
    Thread::start((Thread *)this);
  }
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    Thread::join(&ppTVar2[uVar5]->super_Thread);
    if (ppTVar2[uVar5] != (TestThread *)0x0) {
      (*(ppTVar2[uVar5]->super_Thread)._vptr_Thread[1])();
    }
  }
  if (sharedVar != 0) {
    deAssertFail("sharedVar == 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/decpp/deSpinBarrier.cpp"
                 ,0xfd);
  }
  std::
  vector<de::(anonymous_namespace)::TestThread_*,_std::allocator<de::(anonymous_namespace)::TestThread_*>_>
  ::~vector(&local_60);
  return;
}

Assistant:

void multiThreadTest (int numThreads)
{
	SpinBarrier					barrier		(numThreads);
	volatile deInt32			sharedVar	= 0;
	std::vector<TestThread*>	threads		(numThreads, static_cast<TestThread*>(DE_NULL));

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx] = new TestThread(barrier, &sharedVar, numThreads, ndx);
		DE_TEST_ASSERT(threads[ndx]);
		threads[ndx]->start();
	}

	for (int ndx = 0; ndx < numThreads; ndx++)
	{
		threads[ndx]->join();
		delete threads[ndx];
	}

	DE_TEST_ASSERT(sharedVar == 0);
}